

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiTextBuffer::appendfv(ImGuiTextBuffer *this,char *fmt,__va_list_tag *args)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  char *__dest;
  int iVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  va_list args_copy;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  local_38 = args->reg_save_area;
  local_48._0_4_ = args->gp_offset;
  local_48._4_4_ = args->fp_offset;
  pvStack_40 = args->overflow_arg_area;
  iVar2 = vsnprintf((char *)0x0,0,fmt,args);
  if (iVar2 < 1) {
    return;
  }
  iVar3 = (this->Buf).Size;
  iVar4 = (this->Buf).Capacity;
  uVar7 = iVar3 + (uint)(iVar3 == 0);
  iVar3 = iVar2 + uVar7;
  if (iVar3 < iVar4) {
LAB_0010e4a6:
    if (iVar3 <= iVar4) goto LAB_0010e541;
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    if (iVar5 <= iVar3) {
      iVar5 = iVar3;
    }
  }
  else {
    iVar5 = iVar4 * 2;
    if (iVar4 * 2 < iVar3) {
      iVar5 = iVar3;
    }
    if (iVar5 <= iVar4) goto LAB_0010e4a6;
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar5,GImAllocatorUserData);
  pcVar6 = (this->Buf).Data;
  if (pcVar6 != (char *)0x0) {
    memcpy(__dest,pcVar6,(long)(this->Buf).Size);
    pcVar6 = (this->Buf).Data;
    if ((pcVar6 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar6,GImAllocatorUserData);
  }
  (this->Buf).Data = __dest;
  (this->Buf).Capacity = iVar5;
LAB_0010e541:
  (this->Buf).Size = iVar3;
  if (0 < (int)uVar7) {
    pcVar6 = (this->Buf).Data;
    iVar3 = vsnprintf(pcVar6 + ((ulong)uVar7 - 1),(ulong)(iVar2 + 1U),fmt,&local_48);
    pcVar6 = pcVar6 + ((ulong)uVar7 - 1);
    if (pcVar6 != (char *)0x0) {
      iVar4 = iVar2;
      if (iVar3 < (int)(iVar2 + 1U)) {
        iVar4 = iVar3;
      }
      if (iVar3 == -1) {
        iVar4 = iVar2;
      }
      pcVar6[iVar4] = '\0';
    }
    return;
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68b,"T &ImVector<char>::operator[](int) [T = char]");
}

Assistant:

void ImGuiTextBuffer::appendfv(const char* fmt, va_list args)
{
    va_list args_copy;
    va_copy(args_copy, args);

    int len = ImFormatStringV(NULL, 0, fmt, args);         // FIXME-OPT: could do a first pass write attempt, likely successful on first pass.
    if (len <= 0)
    {
        va_end(args_copy);
        return;
    }

    // Add zero-terminator the first time
    const int write_off = (Buf.Size != 0) ? Buf.Size : 1;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int new_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > new_capacity ? needed_sz : new_capacity);
    }

    Buf.resize(needed_sz);
    ImFormatStringV(&Buf[write_off - 1], (size_t)len + 1, fmt, args_copy);
    va_end(args_copy);
}